

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O1

void __thiscall PathMeld::append(PathMeld *this,PathMeld *op2)

{
  int4 *piVar1;
  pointer pRVar2;
  pointer ppVVar3;
  pointer ppVVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  std::vector<Varnode*,std::allocator<Varnode*>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<Varnode*const*,std::vector<Varnode*,std::allocator<Varnode*>>>>
            ((vector<Varnode*,std::allocator<Varnode*>> *)this,
             (this->commonVn).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (op2->commonVn).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (op2->commonVn).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<PathMeld::RootedOp,std::allocator<PathMeld::RootedOp>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<PathMeld::RootedOp_const*,std::vector<PathMeld::RootedOp,std::allocator<PathMeld::RootedOp>>>>
            ((vector<PathMeld::RootedOp,std::allocator<PathMeld::RootedOp>> *)&this->opMeld,
             (this->opMeld).
             super__Vector_base<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>._M_impl.
             super__Vector_impl_data._M_start,
             (op2->opMeld).
             super__Vector_base<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>._M_impl.
             super__Vector_impl_data._M_start,
             (op2->opMeld).
             super__Vector_base<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>._M_impl.
             super__Vector_impl_data._M_finish);
  pRVar2 = (this->opMeld).
           super__Vector_base<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(this->opMeld).
                super__Vector_base<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pRVar2 >> 4;
  iVar6 = (int)((ulong)((long)(op2->opMeld).
                              super__Vector_base<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(op2->opMeld).
                             super__Vector_base<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if ((ulong)(long)iVar6 < uVar5) {
    ppVVar3 = (op2->commonVn).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppVVar4 = (op2->commonVn).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar7 = (ulong)iVar6;
    do {
      piVar1 = &pRVar2[uVar7].rootVn;
      *piVar1 = *piVar1 + (int)((ulong)((long)ppVVar3 - (long)ppVVar4) >> 3);
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar5);
  }
  return;
}

Assistant:

void PathMeld::append(const PathMeld &op2)

{
  commonVn.insert(commonVn.begin(),op2.commonVn.begin(),op2.commonVn.end());
  opMeld.insert(opMeld.begin(),op2.opMeld.begin(),op2.opMeld.end());
  // Renumber all the rootVn refs to varnodes we have moved
  for(int4 i=op2.opMeld.size();i<opMeld.size();++i)
    opMeld[i].rootVn += op2.commonVn.size();
}